

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm.c
# Opt level: O0

void INT_CMremove_periodic(CMTaskHandle handle)

{
  long *in_RDI;
  CManager_conflict cm;
  
  (**(code **)(*(long *)(*in_RDI + 0x20) + 0x88))
            (&CMstatic_trans_svcs,*(long *)(*in_RDI + 0x20) + 0x58,in_RDI[1]);
  free(in_RDI);
  return;
}

Assistant:

extern void
 INT_CMremove_periodic(CMTaskHandle handle)
 {
     CManager cm = handle->cm;
     cm->control_list->remove_periodic(&CMstatic_trans_svcs,
				       &cm->control_list->select_data, 
				       handle->task);
     free(handle);
 }